

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_load_pkm_image_from_file
          (rf_image *__return_storage_ptr__,char *file,rf_allocator allocator,
          rf_allocator temp_allocator,rf_io_callbacks io)

{
  rf_allocator allocator_00;
  _Bool _Var1;
  rf_int rVar2;
  rf_image local_88;
  undefined8 local_70;
  long local_68;
  undefined4 local_60;
  char *local_58;
  char *local_50;
  undefined8 local_48;
  void *local_40;
  void *src;
  char *pcStack_30;
  int src_size;
  char *file_local;
  rf_allocator temp_allocator_local;
  rf_allocator allocator_local;
  
  temp_allocator_local.user_data = temp_allocator.allocator_proc;
  file_local = (char *)temp_allocator.user_data;
  temp_allocator_local.allocator_proc = (rf_allocator_proc *)allocator.user_data;
  pcStack_30 = file;
  memset(__return_storage_ptr__,0,0x18);
  rVar2 = (*io.file_size_proc)(io.user_data,pcStack_30);
  src._4_4_ = (int)rVar2;
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  local_50 = "rf_load_pkm_image_from_file";
  local_48 = 0x45e8;
  local_70 = 0;
  local_68 = (long)src._4_4_;
  local_60 = 0;
  local_40 = (void *)(*(code *)temp_allocator_local.user_data)(&file_local,1);
  _Var1 = (*io.read_file_proc)(io.user_data,pcStack_30,local_40,(long)src._4_4_);
  if (_Var1) {
    allocator_00.allocator_proc = allocator.allocator_proc;
    allocator_00.user_data = temp_allocator_local.allocator_proc;
    rf_load_pkm_image(&local_88,local_40,(long)src._4_4_,allocator_00);
    __return_storage_ptr__->data = local_88.data;
    __return_storage_ptr__->width = local_88.width;
    __return_storage_ptr__->height = local_88.height;
    __return_storage_ptr__->format = local_88.format;
    __return_storage_ptr__->valid = local_88.valid;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = local_88._21_3_;
  }
  (*(code *)temp_allocator_local.user_data)(&file_local,3);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_load_pkm_image_from_file(const char* file, rf_allocator allocator, rf_allocator temp_allocator, rf_io_callbacks io)
{
    rf_image result = {0};

    int src_size = RF_FILE_SIZE(io, file);
    void* src = RF_ALLOC(temp_allocator, src_size);

    if (RF_READ_FILE(io, file, src, src_size))
    {
        result = rf_load_pkm_image(src, src_size, allocator);
    }

    RF_FREE(temp_allocator, src);

    return result;
}